

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall google::protobuf::compiler::Parser::ParseSyntaxIdentifier(Parser *this)

{
  Tokenizer *pTVar1;
  pointer pcVar2;
  ErrorCollector *pEVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  int iVar7;
  long *plVar8;
  long *plVar9;
  string syntax;
  Token syntax_token;
  long *local_c8;
  long local_c0;
  long local_b8;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  TokenType local_68;
  long *local_60 [2];
  long local_50 [2];
  ulong local_40;
  int local_38;
  
  bVar6 = Consume(this,"syntax","File must begin with \'syntax = \"proto2\";\'.");
  if ((!bVar6) || (bVar6 = Consume(this,"="), !bVar6)) {
    return false;
  }
  pTVar1 = this->input_;
  local_68 = (pTVar1->current_).type;
  pcVar2 = (pTVar1->current_).text._M_dataplus._M_p;
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,pcVar2,pcVar2 + (pTVar1->current_).text._M_string_length);
  local_38 = (pTVar1->current_).end_column;
  local_40._0_4_ = (pTVar1->current_).line;
  local_40._4_4_ = (pTVar1->current_).column;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  bVar6 = ConsumeString(this,&local_a8,"Expected syntax identifier.");
  if ((bVar6) && (bVar6 = ConsumeEndOfDeclaration(this,";",(LocationRecorder *)0x0), bVar6)) {
    std::__cxx11::string::_M_assign((string *)&this->syntax_identifier_);
    iVar7 = std::__cxx11::string::compare((char *)&local_a8);
    uVar5 = local_40;
    bVar6 = true;
    if ((iVar7 == 0) || (this->stop_after_syntax_identifier_ != false)) goto LAB_002193c2;
    uVar4 = local_40 >> 0x20;
    std::operator+(&local_88,"Unrecognized syntax identifier \"",&local_a8);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_88);
    plVar9 = plVar8 + 2;
    if ((long *)*plVar8 == plVar9) {
      local_b8 = *plVar9;
      uStack_b0 = (undefined4)plVar8[3];
      uStack_ac = *(undefined4 *)((long)plVar8 + 0x1c);
      local_c8 = &local_b8;
    }
    else {
      local_b8 = *plVar9;
      local_c8 = (long *)*plVar8;
    }
    local_c0 = plVar8[1];
    *plVar8 = (long)plVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    pEVar3 = this->error_collector_;
    if (pEVar3 != (ErrorCollector *)0x0) {
      (*pEVar3->_vptr_ErrorCollector[2])(pEVar3,uVar5 & 0xffffffff,uVar4,&local_c8);
    }
    this->had_errors_ = true;
    if (local_c8 != &local_b8) {
      operator_delete(local_c8,local_b8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  bVar6 = false;
LAB_002193c2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                             local_a8.field_2._M_local_buf[0]) + 1);
  }
  if (local_60[0] == local_50) {
    return bVar6;
  }
  operator_delete(local_60[0],local_50[0] + 1);
  return bVar6;
}

Assistant:

bool Parser::ParseSyntaxIdentifier() {
  DO(Consume("syntax", "File must begin with 'syntax = \"proto2\";'."));
  DO(Consume("="));
  io::Tokenizer::Token syntax_token = input_->current();
  string syntax;
  DO(ConsumeString(&syntax, "Expected syntax identifier."));
  DO(ConsumeEndOfDeclaration(";", NULL));

  syntax_identifier_ = syntax;

  if (syntax != "proto2" && !stop_after_syntax_identifier_) {
    AddError(syntax_token.line, syntax_token.column,
      "Unrecognized syntax identifier \"" + syntax + "\".  This parser "
      "only recognizes \"proto2\".");
    return false;
  }

  return true;
}